

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_test.cpp
# Opt level: O1

void __thiscall
biosoup::test::BiosoupTimerTest_Start_Test::~BiosoupTimerTest_Start_Test
          (BiosoupTimerTest_Start_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(BiosoupTimerTest, Start) {
  Timer t{};
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.Stop()));
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  t.Start();
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Stop()));
}